

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

string * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ParsedInternalKey *this)

{
  Slice *value;
  string sStack_98;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  char buf [50];
  
  snprintf(buf,0x32,"\' @ %llu : %d",this->sequence,(ulong)this->type);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\'",(allocator *)&sStack_98);
  Slice::ToString_abi_cxx11_(&local_78,&this->user_key);
  local_58 = local_78._M_dataplus._M_p;
  sStack_50 = local_78._M_string_length;
  EscapeString_abi_cxx11_(&sStack_98,(leveldb *)&local_58,value);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
        char buf[50];
        snprintf(buf, sizeof(buf), "' @ %llu : %d",
                 (unsigned long long) sequence,
                 int(type));
        std::string result = "'";
        result += EscapeString(user_key.ToString());
        result += buf;
        return result;
    }